

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O1

void __thiscall btRigidBody::setMassProps(btRigidBody *this,btScalar mass,btVector3 *inertia)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  btScalar bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  bVar8 = 0.0;
  uVar6 = (this->super_btCollisionObject).m_collisionFlags;
  if ((mass != 0.0) || (NAN(mass))) {
    (this->super_btCollisionObject).m_collisionFlags = uVar6 & 0xfffffffe;
    bVar8 = 1.0 / mass;
  }
  else {
    (this->super_btCollisionObject).m_collisionFlags = uVar6 | 1;
  }
  this->m_inverseMass = bVar8;
  uVar3 = *(undefined8 *)(this->m_gravity_acceleration).m_floats;
  auVar9._0_4_ = mass * (float)uVar3;
  auVar9._4_4_ = mass * (float)((ulong)uVar3 >> 0x20);
  auVar9._8_4_ = mass * (this->m_gravity_acceleration).m_floats[2];
  auVar9._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_gravity).m_floats = auVar9;
  fVar1 = inertia->m_floats[2];
  uVar4 = *(ulong *)inertia->m_floats;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar4;
  auVar10 = divps(_DAT_001f53f0,auVar10);
  *(ulong *)(this->m_invInertiaLocal).m_floats =
       CONCAT44(-(uint)((float)(uVar4 >> 0x20) != 0.0) & auVar10._4_4_,
                -(uint)((float)uVar4 != 0.0) & auVar10._0_4_);
  (this->m_invInertiaLocal).m_floats[2] = (btScalar)(-(uint)(fVar1 != 0.0) & (uint)(1.0 / fVar1));
  (this->m_invInertiaLocal).m_floats[3] = 0.0;
  uVar2 = this->m_inverseMass;
  uVar5 = (this->m_linearFactor).m_floats[0];
  auVar7._4_4_ = (this->m_linearFactor).m_floats[1] * (float)uVar2;
  auVar7._0_4_ = (float)uVar2 * (float)uVar5;
  auVar7._8_4_ = (float)uVar2 * (this->m_linearFactor).m_floats[2];
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_invMass).m_floats = auVar7;
  return;
}

Assistant:

void btRigidBody::setMassProps(btScalar mass, const btVector3& inertia)
{
	if (mass == btScalar(0.))
	{
		m_collisionFlags |= btCollisionObject::CF_STATIC_OBJECT;
		m_inverseMass = btScalar(0.);
	} else
	{
		m_collisionFlags &= (~btCollisionObject::CF_STATIC_OBJECT);
		m_inverseMass = btScalar(1.0) / mass;
	}

	//Fg = m * a
	m_gravity = mass * m_gravity_acceleration;
	
	m_invInertiaLocal.setValue(inertia.x() != btScalar(0.0) ? btScalar(1.0) / inertia.x(): btScalar(0.0),
				   inertia.y() != btScalar(0.0) ? btScalar(1.0) / inertia.y(): btScalar(0.0),
				   inertia.z() != btScalar(0.0) ? btScalar(1.0) / inertia.z(): btScalar(0.0));

	m_invMass = m_linearFactor*m_inverseMass;
}